

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstr.hpp
# Opt level: O0

int_type __thiscall zstr::istreambuf::underflow(istreambuf *this)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  int_type iVar4;
  long lVar5;
  long lVar6;
  char *pcVar7;
  pointer pcVar8;
  pointer pzVar9;
  undefined8 uVar10;
  Bytef *pBVar11;
  pointer pcVar12;
  char_type *__c;
  char *in_RDI;
  int ret;
  uchar b1;
  uchar b0;
  streamsize sz;
  int tries;
  char *out_buff_free_start;
  pointer in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  undefined8 in_stack_ffffffffffffff18;
  io_errc __e;
  error_code *in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff40;
  undefined8 uVar13;
  z_stream *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  uInt in_stack_ffffffffffffff54;
  bool local_8c;
  bool local_8b;
  bool local_8a;
  bool local_89;
  int local_14;
  Bytef *local_10;
  
  lVar5 = std::streambuf::gptr();
  lVar6 = std::streambuf::egptr();
  if (lVar5 == lVar6) {
    local_10 = (Bytef *)std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                                  ((unique_ptr<char[],_std::default_delete<char[]>_> *)
                                   CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    local_14 = 0;
    do {
      __e = (io_errc)((ulong)in_stack_ffffffffffffff18 >> 0x20);
      local_14 = local_14 + 1;
      if (1000 < local_14) {
        pcVar7 = (char *)__cxa_allocate_exception(0x20);
        std::error_code::error_code<std::io_errc,void>(in_stack_ffffffffffffff20,__e);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar7,(error_code *)"Failed to fill buffer after 1000 tries");
        __cxa_throw(pcVar7,&std::ios_base::failure[abi:cxx11]::typeinfo,
                    std::ios_base::failure[abi:cxx11]::~failure);
      }
      if (*(long *)(in_RDI + 0x50) == *(long *)(in_RDI + 0x58)) {
        pcVar8 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                           ((unique_ptr<char[],_std::default_delete<char[]>_> *)
                            CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
        *(pointer *)(in_RDI + 0x50) = pcVar8;
        pcVar7 = *(char **)(in_RDI + 0x40);
        pcVar8 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                           ((unique_ptr<char[],_std::default_delete<char[]>_> *)
                            CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
        lVar5 = std::streambuf::sgetn(pcVar7,(long)pcVar8);
        *(long *)(in_RDI + 0x58) = *(long *)(in_RDI + 0x50) + lVar5;
        if (*(long *)(in_RDI + 0x58) == *(long *)(in_RDI + 0x50)) break;
      }
      if (((in_RDI[0x78] & 1U) != 0) && ((in_RDI[0x79] & 1U) == 0)) {
        in_RDI[0x79] = '\x01';
        cVar1 = *(char *)(*(long *)(in_RDI + 0x50) + 1);
        local_89 = false;
        if (*(long *)(in_RDI + 0x50) + 2U <= *(ulong *)(in_RDI + 0x58)) {
          if ((**(char **)(in_RDI + 0x50) != '\x1f') || (local_8a = true, cVar1 != -0x75)) {
            local_8b = false;
            if (**(char **)(in_RDI + 0x50) == 'x') {
              local_8c = true;
              if ((cVar1 != '\x01') && (local_8c = true, cVar1 != -100)) {
                local_8c = cVar1 == -0x26;
              }
              local_8b = local_8c;
            }
            local_8a = local_8b;
          }
          local_89 = local_8a;
        }
        in_RDI[0x7a] = (local_89 ^ 0xffU) & 1;
      }
      if ((in_RDI[0x7a] & 1U) == 0) {
        bVar2 = std::unique_ptr::operator_cast_to_bool
                          ((unique_ptr<zstr::detail::z_stream_wrapper,_std::default_delete<zstr::detail::z_stream_wrapper>_>
                            *)0x423c42);
        if (!bVar2) {
          operator_new(0x78);
          detail::z_stream_wrapper::z_stream_wrapper
                    ((z_stream_wrapper *)
                     CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     SUB81((ulong)in_stack_ffffffffffffff48 >> 0x38,0),
                     (int)in_stack_ffffffffffffff48,(int)((ulong)in_stack_ffffffffffffff40 >> 0x20))
          ;
          std::
          unique_ptr<zstr::detail::z_stream_wrapper,std::default_delete<zstr::detail::z_stream_wrapper>>
          ::unique_ptr<std::default_delete<zstr::detail::z_stream_wrapper>,void>
                    ((unique_ptr<zstr::detail::z_stream_wrapper,_std::default_delete<zstr::detail::z_stream_wrapper>_>
                      *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                     in_stack_ffffffffffffff08);
          std::
          unique_ptr<zstr::detail::z_stream_wrapper,_std::default_delete<zstr::detail::z_stream_wrapper>_>
          ::operator=((unique_ptr<zstr::detail::z_stream_wrapper,_std::default_delete<zstr::detail::z_stream_wrapper>_>
                       *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                      (unique_ptr<zstr::detail::z_stream_wrapper,_std::default_delete<zstr::detail::z_stream_wrapper>_>
                       *)in_stack_ffffffffffffff08);
          std::
          unique_ptr<zstr::detail::z_stream_wrapper,_std::default_delete<zstr::detail::z_stream_wrapper>_>
          ::~unique_ptr((unique_ptr<zstr::detail::z_stream_wrapper,_std::default_delete<zstr::detail::z_stream_wrapper>_>
                         *)in_stack_ffffffffffffff20);
        }
        in_stack_ffffffffffffff48 = *(z_stream **)(in_RDI + 0x50);
        pzVar9 = std::
                 unique_ptr<zstr::detail::z_stream_wrapper,_std::default_delete<zstr::detail::z_stream_wrapper>_>
                 ::operator->((unique_ptr<zstr::detail::z_stream_wrapper,_std::default_delete<zstr::detail::z_stream_wrapper>_>
                               *)0x423cf2);
        (pzVar9->super_z_stream).next_in = (Bytef *)in_stack_ffffffffffffff48;
        in_stack_ffffffffffffff54 =
             (int)*(undefined8 *)(in_RDI + 0x58) - (int)*(undefined8 *)(in_RDI + 0x50);
        pzVar9 = std::
                 unique_ptr<zstr::detail::z_stream_wrapper,_std::default_delete<zstr::detail::z_stream_wrapper>_>
                 ::operator->((unique_ptr<zstr::detail::z_stream_wrapper,_std::default_delete<zstr::detail::z_stream_wrapper>_>
                               *)0x423d1a);
        (pzVar9->super_z_stream).avail_in = in_stack_ffffffffffffff54;
        pzVar9 = std::
                 unique_ptr<zstr::detail::z_stream_wrapper,_std::default_delete<zstr::detail::z_stream_wrapper>_>
                 ::operator->((unique_ptr<zstr::detail::z_stream_wrapper,_std::default_delete<zstr::detail::z_stream_wrapper>_>
                               *)0x423d3f);
        (pzVar9->super_z_stream).next_out = local_10;
        pcVar8 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                           ((unique_ptr<char[],_std::default_delete<char[]>_> *)
                            CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
        uVar13 = *(undefined8 *)(in_RDI + 0x70);
        pzVar9 = std::
                 unique_ptr<zstr::detail::z_stream_wrapper,_std::default_delete<zstr::detail::z_stream_wrapper>_>
                 ::operator->((unique_ptr<zstr::detail::z_stream_wrapper,_std::default_delete<zstr::detail::z_stream_wrapper>_>
                               *)0x423d7d);
        (pzVar9->super_z_stream).avail_out = ((int)pcVar8 + (int)uVar13) - (int)local_10;
        pzVar9 = std::
                 unique_ptr<zstr::detail::z_stream_wrapper,_std::default_delete<zstr::detail::z_stream_wrapper>_>
                 ::get((unique_ptr<zstr::detail::z_stream_wrapper,_std::default_delete<zstr::detail::z_stream_wrapper>_>
                        *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
        iVar3 = inflate(pzVar9,0);
        if ((iVar3 != 0) && (iVar3 != 1)) {
          uVar10 = __cxa_allocate_exception(0x20);
          uVar13 = uVar10;
          std::
          unique_ptr<zstr::detail::z_stream_wrapper,_std::default_delete<zstr::detail::z_stream_wrapper>_>
          ::get((unique_ptr<zstr::detail::z_stream_wrapper,_std::default_delete<zstr::detail::z_stream_wrapper>_>
                 *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
          Exception::Exception
                    ((Exception *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     in_stack_ffffffffffffff48,(int)((ulong)uVar13 >> 0x20));
          __cxa_throw(uVar10,&Exception::typeinfo,Exception::~Exception);
        }
        pzVar9 = std::
                 unique_ptr<zstr::detail::z_stream_wrapper,_std::default_delete<zstr::detail::z_stream_wrapper>_>
                 ::operator->((unique_ptr<zstr::detail::z_stream_wrapper,_std::default_delete<zstr::detail::z_stream_wrapper>_>
                               *)0x423e45);
        *(Bytef **)(in_RDI + 0x50) = (pzVar9->super_z_stream).next_in;
        lVar5 = *(long *)(in_RDI + 0x50);
        pzVar9 = std::
                 unique_ptr<zstr::detail::z_stream_wrapper,_std::default_delete<zstr::detail::z_stream_wrapper>_>
                 ::operator->((unique_ptr<zstr::detail::z_stream_wrapper,_std::default_delete<zstr::detail::z_stream_wrapper>_>
                               *)0x423e66);
        *(ulong *)(in_RDI + 0x58) = lVar5 + (ulong)(pzVar9->super_z_stream).avail_in;
        pzVar9 = std::
                 unique_ptr<zstr::detail::z_stream_wrapper,_std::default_delete<zstr::detail::z_stream_wrapper>_>
                 ::operator->((unique_ptr<zstr::detail::z_stream_wrapper,_std::default_delete<zstr::detail::z_stream_wrapper>_>
                               *)0x423e89);
        local_10 = (pzVar9->super_z_stream).next_out;
        if (iVar3 == 1) {
          std::
          unique_ptr<zstr::detail::z_stream_wrapper,_std::default_delete<zstr::detail::z_stream_wrapper>_>
          ::reset((unique_ptr<zstr::detail::z_stream_wrapper,_std::default_delete<zstr::detail::z_stream_wrapper>_>
                   *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                  in_stack_ffffffffffffff08);
        }
      }
      else {
        std::swap<char[],std::default_delete<char[]>>
                  ((unique_ptr<char[],_std::default_delete<char[]>_> *)
                   CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (unique_ptr<char[],_std::default_delete<char[]>_> *)in_stack_ffffffffffffff08);
        local_10 = *(Bytef **)(in_RDI + 0x58);
        pcVar8 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                           ((unique_ptr<char[],_std::default_delete<char[]>_> *)
                            CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
        *(pointer *)(in_RDI + 0x50) = pcVar8;
        pcVar8 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                           ((unique_ptr<char[],_std::default_delete<char[]>_> *)
                            CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
        *(pointer *)(in_RDI + 0x58) = pcVar8;
      }
      pBVar11 = (Bytef *)std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                                   ((unique_ptr<char[],_std::default_delete<char[]>_> *)
                                    CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    } while (local_10 == pBVar11);
    pcVar8 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                       ((unique_ptr<char[],_std::default_delete<char[]>_> *)
                        CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    pcVar12 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                        ((unique_ptr<char[],_std::default_delete<char[]>_> *)
                         CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    std::streambuf::setg(in_RDI,pcVar8,pcVar12);
  }
  lVar5 = std::streambuf::gptr();
  lVar6 = std::streambuf::egptr();
  if (lVar5 == lVar6) {
    iVar4 = std::char_traits<char>::eof();
  }
  else {
    __c = (char_type *)std::streambuf::gptr();
    iVar4 = std::char_traits<char>::to_int_type(__c);
  }
  return iVar4;
}

Assistant:

std::streambuf::int_type underflow() override {
    if (this->gptr() == this->egptr()) {
      // pointers for free region in output buffer
      char* out_buff_free_start = out_buff.get();
      int tries = 0;
      do {
        if (++tries > 1000) {
          throw std::ios_base::failure(
              "Failed to fill buffer after 1000 tries");
        }

        // read more input if none available
        if (in_buff_start == in_buff_end) {
          // empty input buffer: refill from the start
          in_buff_start = in_buff.get();
          std::streamsize sz = sbuf_p->sgetn(
              in_buff.get(), static_cast<std::streamsize>(buff_size));
          in_buff_end = in_buff_start + sz;
          if (in_buff_end == in_buff_start) break;  // end of input
        }
        // auto detect if the stream contains text or deflate data
        if (auto_detect && !auto_detect_run) {
          auto_detect_run = true;
          unsigned char b0 = *reinterpret_cast<unsigned char*>(in_buff_start);
          unsigned char b1 =
              *reinterpret_cast<unsigned char*>(in_buff_start + 1);
          // Ref:
          // http://en.wikipedia.org/wiki/Gzip
          // http://stackoverflow.com/questions/9050260/what-does-a-zlib-header-look-like
          is_text = !(in_buff_start + 2 <= in_buff_end &&
                      ((b0 == 0x1F && b1 == 0x8B)     // gzip header
                       || (b0 == 0x78 && (b1 == 0x01  // zlib header
                                          || b1 == 0x9C || b1 == 0xDA))));
        }
        if (is_text) {
          // simply swap in_buff and out_buff, and adjust pointers
          assert(in_buff_start == in_buff.get());
          std::swap(in_buff, out_buff);
          out_buff_free_start = in_buff_end;
          in_buff_start = in_buff.get();
          in_buff_end = in_buff.get();
        } else {
          // run inflate() on input
          if (!zstrm_p)
            zstrm_p = std::unique_ptr<detail::z_stream_wrapper>(
                new detail::z_stream_wrapper(true, Z_DEFAULT_COMPRESSION,
                                             window_bits));
          zstrm_p->next_in =
              reinterpret_cast<decltype(zstrm_p->next_in)>(in_buff_start);
          zstrm_p->avail_in = uint32_t(in_buff_end - in_buff_start);
          zstrm_p->next_out = reinterpret_cast<decltype(zstrm_p->next_out)>(
              out_buff_free_start);
          zstrm_p->avail_out =
              uint32_t((out_buff.get() + buff_size) - out_buff_free_start);
          int ret = inflate(zstrm_p.get(), Z_NO_FLUSH);
          // process return code
          if (ret != Z_OK && ret != Z_STREAM_END)
            throw Exception(zstrm_p.get(), ret);
          // update in&out pointers following inflate()
          in_buff_start =
              reinterpret_cast<decltype(in_buff_start)>(zstrm_p->next_in);
          in_buff_end = in_buff_start + zstrm_p->avail_in;
          out_buff_free_start = reinterpret_cast<decltype(out_buff_free_start)>(
              zstrm_p->next_out);
          assert(out_buff_free_start + zstrm_p->avail_out ==
                 out_buff.get() + buff_size);

          if (ret == Z_STREAM_END) {
            // if stream ended, deallocate inflator
            zstrm_p.reset();
          }
        }
      } while (out_buff_free_start == out_buff.get());
      // 2 exit conditions:
      // - end of input: there might or might not be output available
      // - out_buff_free_start != out_buff: output available
      this->setg(out_buff.get(), out_buff.get(), out_buff_free_start);
    }
    return this->gptr() == this->egptr()
               ? traits_type::eof()
               : traits_type::to_int_type(*this->gptr());
  }